

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O3

PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::AllocPageSegment(DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                   *segmentList,
                  PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                  *pageAllocator,bool committed,bool allocated,bool enableWriteBarrier)

{
  bool bVar1;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this;
  
  this = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,RealCount>::
         PrependNode<Memory::NoThrowHeapAllocator,Memory::PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>>*,bool,bool,bool>
                   ((DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,RealCount>
                     *)segmentList,(NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance,
                    pageAllocator,committed,allocated,enableWriteBarrier);
  if (this != (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)0x0) {
    bVar1 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::Initialize
                      (this,(uint)committed << 0xc | pageAllocator->allocFlags,
                       pageAllocator->excludeGuardPages);
    if (bVar1) {
      return this;
    }
    DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
    RemoveHead<Memory::NoThrowHeapAllocator>
              (segmentList,(NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance);
  }
  return (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)0x0;
}

Assistant:

TPageSegment *
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::AllocPageSegment(
    DListBase<TPageSegment>& segmentList,
    PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment> * pageAllocator,
    bool committed, bool allocated, bool enableWriteBarrier)
{
    TPageSegment * segment = segmentList.PrependNode(&NoThrowNoMemProtectHeapAllocator::Instance,
        pageAllocator, committed, allocated, enableWriteBarrier);

    if (segment == nullptr)
    {
        return nullptr;
    }

    if (!segment->Initialize((committed ? MEM_COMMIT : 0) | pageAllocator->allocFlags, pageAllocator->excludeGuardPages))
    {
        segmentList.RemoveHead(&NoThrowNoMemProtectHeapAllocator::Instance);
        return nullptr;
    }
    return segment;
}